

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

string * stage_to_string_abi_cxx11_(string *__return_storage_ptr__,VkShaderStageFlagBits stage)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(stage) {
  case VK_SHADER_STAGE_VERTEX_BIT:
    pcVar2 = "vert";
    paVar1 = &local_9;
    break;
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
    pcVar2 = "tesc";
    paVar1 = &local_a;
    break;
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
    pcVar2 = "tese";
    paVar1 = &local_b;
    break;
  case VK_SHADER_STAGE_GEOMETRY_BIT:
    pcVar2 = "geom";
    paVar1 = &local_c;
    break;
  default:
    if (stage == VK_SHADER_STAGE_FRAGMENT_BIT) {
      pcVar2 = "frag";
      paVar1 = &local_d;
      break;
    }
    if (stage == VK_SHADER_STAGE_COMPUTE_BIT) {
      pcVar2 = "comp";
      paVar1 = &local_e;
      break;
    }
    if (stage == VK_SHADER_STAGE_TASK_BIT_EXT) {
      pcVar2 = "task";
      paVar1 = &local_15;
      break;
    }
    if (stage == VK_SHADER_STAGE_MESH_BIT_EXT) {
      pcVar2 = "mesh";
      paVar1 = &local_16;
      break;
    }
    if (stage == VK_SHADER_STAGE_RAYGEN_BIT_KHR) {
      pcVar2 = "rgen";
      paVar1 = &local_f;
      break;
    }
    if (stage == VK_SHADER_STAGE_ANY_HIT_BIT_KHR) {
      pcVar2 = "rahit";
      paVar1 = &local_12;
      break;
    }
    if (stage == VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR) {
      pcVar2 = "rchit";
      paVar1 = &local_13;
      break;
    }
    if (stage == VK_SHADER_STAGE_MISS_BIT_KHR) {
      pcVar2 = "rmiss";
      paVar1 = &local_11;
      break;
    }
    if (stage == VK_SHADER_STAGE_INTERSECTION_BIT_KHR) {
      pcVar2 = "rint";
      paVar1 = &local_10;
      break;
    }
    if (stage == VK_SHADER_STAGE_CALLABLE_BIT_KHR) {
      pcVar2 = "rcall";
      paVar1 = &local_14;
      break;
    }
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
       VK_SHADER_STAGE_VERTEX_BIT:
    pcVar2 = "????";
    paVar1 = &local_17;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

static string stage_to_string(VkShaderStageFlagBits stage)
{
	switch (stage)
	{
	case VK_SHADER_STAGE_VERTEX_BIT:
		return "vert";
	case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
		return "tesc";
	case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
		return "tese";
	case VK_SHADER_STAGE_GEOMETRY_BIT:
		return "geom";
	case VK_SHADER_STAGE_FRAGMENT_BIT:
		return "frag";
	case VK_SHADER_STAGE_COMPUTE_BIT:
		return "comp";
	case VK_SHADER_STAGE_RAYGEN_BIT_KHR:
		return "rgen";
	case VK_SHADER_STAGE_INTERSECTION_BIT_KHR:
		return "rint";
	case VK_SHADER_STAGE_MISS_BIT_KHR:
		return "rmiss";
	case VK_SHADER_STAGE_ANY_HIT_BIT_KHR:
		return "rahit";
	case VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR:
		return "rchit";
	case VK_SHADER_STAGE_CALLABLE_BIT_KHR:
		return "rcall";
	case VK_SHADER_STAGE_TASK_BIT_EXT:
		return "task";
	case VK_SHADER_STAGE_MESH_BIT_EXT:
		return "mesh";
	default:
		return "????";
	}
}